

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O0

void __thiscall cashew::JSPrinter::printContinue(JSPrinter *this,Ref node)

{
  bool bVar1;
  Ref *pRVar2;
  Value *this_00;
  char *s;
  JSPrinter *this_local;
  Ref node_local;
  
  this_local = (JSPrinter *)node.inst;
  emit(this,"continue");
  pRVar2 = Ref::operator[]((Ref *)&this_local,1);
  bVar1 = Ref::operator!(pRVar2);
  if (!bVar1) {
    emit(this,' ');
    pRVar2 = Ref::operator[]((Ref *)&this_local,1);
    this_00 = Ref::operator->(pRVar2);
    s = cashew::Value::getCString(this_00);
    emit(this,s);
  }
  return;
}

Assistant:

void printContinue(Ref node) {
    emit("continue");
    if (!!node[1]) {
      emit(' ');
      emit(node[1]->getCString());
    }
  }